

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpageranges.cpp
# Opt level: O2

void __thiscall QPageRanges::addRange(QPageRanges *this,int from,int to)

{
  int iVar1;
  long in_FS_OFFSET;
  undefined1 local_40 [12];
  undefined8 uStack_34;
  undefined4 local_2c;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((from < 1) || (to < 1)) {
    local_40._0_4_ = 2;
    local_2c = 0;
    local_40._4_8_ = 0;
    uStack_34 = 0;
    local_28 = "default";
    QMessageLogger::warning
              (local_40,"QPageRanges::addRange: \'from\' and \'to\' must be greater than 0");
  }
  else {
    iVar1 = from;
    if ((uint)to < (uint)from) {
      iVar1 = to;
    }
    if ((uint)from < (uint)to) {
      from = to;
    }
    detach(this);
    local_40._4_4_ = from;
    local_40._0_4_ = iVar1;
    QList<QPageRanges::Range>::emplaceBack<QPageRanges::Range>
              (&((this->d).d.ptr)->intervals,(Range *)local_40);
    QPageRangesPrivate::mergeIntervals((this->d).d.ptr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPageRanges::addRange(int from, int to)
{
    if (from <= 0 || to <= 0) {
        qWarning("QPageRanges::addRange: 'from' and 'to' must be greater than 0");
        return;
    }
    if (to < from)
        std::swap(from, to);

    detach();
    d->intervals.append({from, to});
    d->mergeIntervals();
}